

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

void __thiscall Problem_CGBG_FF::AddEdge(Problem_CGBG_FF *this,Index hI)

{
  bool bVar1;
  BayesianGameBase *pBVar2;
  ostream *poVar3;
  ostream *this_00;
  undefined8 uVar4;
  uint in_ESI;
  int __x;
  long *in_RDI;
  double dVar5;
  stringstream ss;
  double p;
  double psum;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nr_types;
  vector<unsigned_int,_std::allocator<unsigned_int>_> types_e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nr_actions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> actions_e;
  size_t k;
  Index e;
  Scope *tupleOfAgents;
  stringstream *in_stack_fffffffffffffd28;
  undefined2 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd32;
  undefined1 in_stack_fffffffffffffd33;
  undefined4 in_stack_fffffffffffffd34;
  uint uVar6;
  allocator_type *in_stack_fffffffffffffd38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffde0;
  Scope *in_stack_fffffffffffffde8;
  Problem_CGBG_FF *in_stack_fffffffffffffdf0;
  Scope *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  Index in_stack_fffffffffffffe04;
  Problem_CGBG_FF *in_stack_fffffffffffffe08;
  double local_90;
  undefined1 local_78 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  undefined4 local_44;
  undefined1 local_40 [24];
  size_type local_28;
  uint local_1c;
  reference local_18;
  uint local_c;
  
  local_c = in_ESI;
  local_18 = std::vector<Scope,_std::allocator<Scope>_>::at
                       ((vector<Scope,_std::allocator<Scope>_> *)
                        CONCAT44(in_stack_fffffffffffffd34,
                                 CONCAT13(in_stack_fffffffffffffd33,
                                          CONCAT12(in_stack_fffffffffffffd32,
                                                   in_stack_fffffffffffffd30))),
                        (size_type)in_stack_fffffffffffffd28);
  BayesianGameCollaborativeGraphical::AddLRF
            ((BayesianGameCollaborativeGraphical *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),in_stack_fffffffffffffdf8
            );
  local_1c = local_c;
  local_28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_18->super_SDT);
  local_44 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8ecf8b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict1 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8ecfbf);
  pBVar2 = (BayesianGameBase *)(**(code **)(*in_RDI + 0x118))(in_RDI,local_1c);
  local_60 = BayesianGameBase::GetNrActions(pBVar2);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8ed03b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type_conflict1 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8ed06f);
  pBVar2 = (BayesianGameBase *)(**(code **)(*in_RDI + 0x118))(in_RDI,local_1c);
  BayesianGameBase::GetNrTypes(pBVar2);
  local_90 = 0.0;
  do {
    dVar5 = ComputeLocalProbability
                      (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0
                      );
    local_90 = local_90 + dVar5;
    (**(code **)(*in_RDI + 0xe8))(dVar5,in_RDI,local_1c,local_78);
    __x = (int)local_78;
    bVar1 = IndexTools::Increment(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  dVar5 = local_90 + -1.0;
  std::abs(__x);
  if (dVar5 < 1e-06) {
    do {
      do {
        uVar6 = local_1c;
        dVar5 = ComputeLocalUtility(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                                    in_stack_fffffffffffffdf8,
                                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    in_stack_fffffffffffffdf0,&in_stack_fffffffffffffde8->super_SDT)
        ;
        (**(code **)(*in_RDI + 0x110))(dVar5,in_RDI,uVar6,local_78,local_40);
        bVar1 = IndexTools::Increment(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
      bVar1 = IndexTools::Increment(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffd40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffd40);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffde0);
  poVar3 = std::operator<<((ostream *)&stack0xfffffffffffffdf0,"Joint type probabilities for house "
                          );
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
  poVar3 = std::operator<<(poVar3," do not sum to 1.0, but to ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_90);
  this_00 = std::operator<<(poVar3,", a difference of ");
  local_90 = local_90 + -1.0;
  std::abs((int)poVar3);
  poVar3 = (ostream *)std::ostream::operator<<(this_00,local_90);
  std::operator<<(poVar3,"!");
  uVar4 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT44(in_stack_fffffffffffffd34,
                     CONCAT13(in_stack_fffffffffffffd33,
                              CONCAT12(in_stack_fffffffffffffd32,in_stack_fffffffffffffd30))),
       in_stack_fffffffffffffd28);
  __cxa_throw(uVar4,&E::typeinfo,E::~E);
}

Assistant:

void Problem_CGBG_FF::AddEdge(Index hI)
{
    const Scope & tupleOfAgents = _m_agentsForHouse_action.at(hI);
#if DEBUGADDEDGE     
    cout << "-------------------------------------"<<endl;
    cout << "Adding payoff component for house "<< hI  << endl
        << "\tscope="<< tupleOfAgents << endl;
    cout << "nr types:"<< SoftPrintVector( this->GetNrTypes() ) << endl;
#endif
    AddLRF(tupleOfAgents);
    //Index e=GetNrLRFs()-1;
    Index e=hI;
    size_t k = tupleOfAgents.size();
    vector<Index> actions_e(k, 0);
    const vector<size_t>& nr_actions = GetBGIPforLRF(e)->GetNrActions();
    vector<Index> types_e(k, 0);
    const vector<size_t>& nr_types = GetBGIPforLRF(e)->GetNrTypes();

#if DEBUGADDEDGE     
    cout<< "\tnr_actions=" << PrintTools::SoftPrintVector(nr_actions) << endl
        << "\tnr_types=" << PrintTools::SoftPrintVector(nr_types) << endl;
    cout << "-------------------------------------"<<endl;
#endif
    double psum = 0.0;
    do{
#if DEBUGPROBS        
        cout << "Computing local type prob. P(" << PrintTools::SoftPrintVector(types_e) << ")..."<<endl;
#endif
        double p = ComputeLocalProbability(tupleOfAgents, types_e);
#if DEBUGPROBS        
        cout << "...P(" << PrintTools::SoftPrintVector(types_e) << ")="<<p<<endl;
#endif
        psum += p;
        SetProbability(e, types_e, p);
    }while(!IndexTools::Increment(types_e, nr_types));
    if(! (abs(psum-1.0)<1e-6))
    {
        stringstream ss;
        ss << "Joint type probabilities for house "<<hI<<" do not sum to 1.0, but to " 
            << psum << ", a difference of " << abs(psum-1) << "!";
        throw E(ss);
    }
    do{
        do{
            SetUtility(e, types_e, actions_e, ComputeLocalUtility(hI, tupleOfAgents,  actions_e, types_e));
        }while(!IndexTools::Increment(types_e, nr_types));
    }while(!IndexTools::Increment(actions_e, nr_actions));
}